

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake.c
# Opt level: O0

decaf_error_t
decaf_sha3_hash(uint8_t *out,size_t outlen,uint8_t *in,size_t inlen,decaf_kparams_s *params)

{
  decaf_error_t dVar1;
  decaf_error_t ret;
  decaf_keccak_sponge_t decaf_sponge;
  decaf_kparams_s *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  size_t in_stack_ffffffffffffff10;
  uint8_t *in_stack_ffffffffffffff18;
  decaf_keccak_sponge_s *in_stack_ffffffffffffff20;
  decaf_keccak_sponge_s *in_stack_ffffffffffffff28;
  
  decaf_sha3_init((decaf_keccak_sponge_s *)
                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  in_stack_fffffffffffffef8);
  decaf_sha3_update(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  dVar1 = decaf_sha3_output(in_stack_ffffffffffffff28,(uint8_t *)in_stack_ffffffffffffff20,
                            (size_t)in_stack_ffffffffffffff18);
  decaf_sha3_destroy((decaf_keccak_sponge_s *)0x108d93);
  return dVar1;
}

Assistant:

decaf_error_t decaf_sha3_hash (
    uint8_t *out,
    size_t outlen,
    const uint8_t *in,
    size_t inlen,
    const struct decaf_kparams_s *params
) {
    decaf_keccak_sponge_t decaf_sponge;
    decaf_sha3_init(decaf_sponge, params);
    decaf_sha3_update(decaf_sponge, in, inlen);
    decaf_error_t ret = decaf_sha3_output(decaf_sponge, out, outlen);
    decaf_sha3_destroy(decaf_sponge);
    return ret;
}